

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

int Cof_NodeRef_rec(Cof_Obj_t *pNode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  for (; (uVar1 = *(uint *)pNode, (uVar1 & 0xf0) != 0 &&
         (*(uint *)pNode = uVar1 + 0x100, uVar1 < 0x100));
      pNode = (Cof_Obj_t *)((long)pNode + ((ulong)pNode[1].nFanoutsM & 0x7fffffff) * -4)) {
    iVar2 = Cof_NodeRef_rec((Cof_Obj_t *)
                            ((long)pNode + ((ulong)*(uint *)(pNode + 1) & 0x7fffffff) * -4));
    iVar3 = iVar3 + iVar2 + 1;
  }
  return iVar3;
}

Assistant:

int Cof_NodeRef_rec( Cof_Obj_t * pNode )
{
    if ( pNode->nFanins == 0 )
        return 0;
    if ( pNode->nFanouts++ > 0 )
        return 0;
    return 1 + Cof_NodeRef_rec( Cof_ObjFanin(pNode, 0) )
             + Cof_NodeRef_rec( Cof_ObjFanin(pNode, 1) );
}